

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O1

void __thiscall Assimp::glTFImporter::ImportMeshes(glTFImporter *this,Asset *r)

{
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *plVar1;
  ulong uVar2;
  pointer *ppuVar3;
  PrimitiveMode PVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  iterator iVar8;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar9;
  vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *pvVar10;
  BufferView *pBVar11;
  vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *pvVar12;
  long lVar13;
  aiScene *paVar14;
  long lVar15;
  bool bVar16;
  Object *pOVar17;
  _Alloc_hider _Var18;
  undefined8 uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  pointer ppMVar25;
  aiMesh *paVar26;
  pointer pRVar27;
  float *pfVar28;
  ulong *puVar29;
  uint *puVar30;
  undefined4 *puVar31;
  aiFace *paVar32;
  undefined8 *puVar33;
  aiMesh **ppaVar34;
  runtime_error *prVar35;
  long *plVar36;
  ulong uVar37;
  Accessor *pAVar38;
  char *pcVar39;
  ulong uVar40;
  undefined8 uVar41;
  ulong uVar42;
  int iVar43;
  ulong uVar44;
  char *pcVar45;
  pointer pPVar46;
  ulong *puVar47;
  ulong uVar48;
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *plVar49;
  aiFace *paVar50;
  bool bVar51;
  Ref<glTF::Buffer> RVar52;
  uint k;
  Indexer data;
  aiMesh *aim;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  uint local_dc;
  Mesh *local_d8;
  Indexer local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  aiMesh **local_78;
  Asset *local_70;
  ulong *local_68;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_60;
  LazyDict<glTF::Buffer> *local_58;
  string local_50;
  
  local_88._M_allocated_capacity = 0;
  local_88._8_8_ = (aiMesh **)0x0;
  local_78 = (aiMesh **)0x0;
  local_dc = 0;
  ppMVar25 = (r->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_70 = r;
  if (((long)(r->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar25 & 0x7fffffff8U) != 0) {
    local_58 = &r->buffers;
    local_60 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->meshOffsets;
    uVar48 = 0;
    do {
      local_d8 = ppMVar25[uVar48];
      if (*(size_t *)
           ((long)&(local_d8->Extension).
                   super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                   ._M_impl + 0x10) != 0) {
        plVar1 = &local_d8->Extension;
        pOVar17 = &local_d8->super_Object;
        plVar49 = plVar1;
        while (plVar49 = *(list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                           **)&(plVar49->
                               super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                               )._M_impl._M_node, plVar49 != plVar1) {
          sVar7 = *(size_t *)
                   ((long)&(plVar49->
                           super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                           )._M_impl._M_node + 0x10);
          if (*(int *)(sVar7 + 8) != 0) {
            prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
            to_string<glTF::Mesh::SExtension::EType>(&local_50,*(EType *)(sVar7 + 8));
            std::operator+(&local_b0,"GLTF: Can not import mesh: unknown mesh extension (code: \"",
                           &local_50);
            plVar36 = (long *)std::__cxx11::string::append((char *)&local_b0);
            local_d0.accessor = (Accessor *)*plVar36;
            pAVar38 = (Accessor *)(plVar36 + 2);
            if (local_d0.accessor == pAVar38) {
              local_d0.elemSize = (size_t)(pAVar38->super_Object)._vptr_Object;
              local_d0.stride = plVar36[3];
              local_d0.accessor = (Accessor *)&local_d0.elemSize;
            }
            else {
              local_d0.elemSize = (size_t)(pAVar38->super_Object)._vptr_Object;
            }
            local_d0.data = (uint8_t *)plVar36[1];
            *plVar36 = (long)pAVar38;
            plVar36[1] = 0;
            *(undefined1 *)(plVar36 + 2) = 0;
            std::runtime_error::runtime_error(prVar35,(string *)&local_d0);
            *(undefined ***)prVar35 = &PTR__runtime_error_00900168;
            __cxa_throw(prVar35,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (2 < (ulong)(((long)*(pointer *)
                                  ((long)&(local_d8->primitives).
                                          super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                          ._M_impl + 8) -
                           *(long *)&(local_d8->primitives).
                                     super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                     ._M_impl.super__Vector_impl_data >> 4) * 0x4ec4ec4ec4ec4ec5)) {
            prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_d0.accessor = (Accessor *)&local_d0.elemSize;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,
                       "GLTF: When using Open3DGC compression then only one primitive per mesh are allowed."
                       ,"");
            std::runtime_error::runtime_error(prVar35,(string *)&local_d0);
            *(undefined ***)prVar35 = &PTR__runtime_error_00900168;
            __cxa_throw(prVar35,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          RVar52 = glTF::LazyDict<glTF::Buffer>::Get(local_58,*(char **)(sVar7 + 0x10));
          glTF::Buffer::EncodedRegion_SetCurrent
                    (((RVar52.vector)->
                     super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[RVar52._8_8_ & 0xffffffff],&pOVar17->id);
        }
      }
      iVar8._M_current =
           (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_60,iVar8,&local_dc);
      }
      else {
        *iVar8._M_current = local_dc;
        ppuVar3 = &(this->meshOffsets).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar3 = *ppuVar3 + 1;
      }
      local_dc = local_dc +
                 (int)((ulong)((long)*(pointer *)
                                      ((long)&(local_d8->primitives).
                                              super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                              ._M_impl + 8) -
                              *(long *)&(local_d8->primitives).
                                        super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                        ._M_impl.super__Vector_impl_data) >> 4) * -0x3b13b13b;
      pPVar46 = (local_d8->primitives).
                super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(local_d8->primitives).
                   super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                   ._M_impl + 8) != pPVar46) {
        local_90 = 0;
        do {
          paVar26 = (aiMesh *)operator_new(0x520);
          paVar26->mPrimitiveTypes = 0;
          paVar26->mNumVertices = 0;
          paVar26->mNumFaces = 0;
          memset(&paVar26->mVertices,0,0xcc);
          paVar26->mBones = (aiBone **)0x0;
          paVar26->mMaterialIndex = 0;
          (paVar26->mName).length = 0;
          (paVar26->mName).data[0] = '\0';
          memset((paVar26->mName).data + 1,0x1b,0x3ff);
          paVar26->mNumAnimMeshes = 0;
          paVar26->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar26->mMethod = 0;
          (paVar26->mAABB).mMin.x = 0.0;
          (paVar26->mAABB).mMin.y = 0.0;
          (paVar26->mAABB).mMin.z = 0.0;
          (paVar26->mAABB).mMax.x = 0.0;
          (paVar26->mAABB).mMax.y = 0.0;
          (paVar26->mAABB).mMax.z = 0.0;
          paVar26->mTextureCoords[0] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[1] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[2] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[3] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[4] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[5] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[6] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[7] = (aiVector3D *)0x0;
          paVar26->mNumUVComponents[0] = 0;
          paVar26->mNumUVComponents[1] = 0;
          paVar26->mNumUVComponents[2] = 0;
          paVar26->mNumUVComponents[3] = 0;
          paVar26->mNumUVComponents[4] = 0;
          paVar26->mNumUVComponents[5] = 0;
          paVar26->mNumUVComponents[6] = 0;
          paVar26->mNumUVComponents[7] = 0;
          paVar26->mColors[0] = (aiColor4D *)0x0;
          paVar26->mColors[1] = (aiColor4D *)0x0;
          paVar26->mColors[2] = (aiColor4D *)0x0;
          paVar26->mColors[3] = (aiColor4D *)0x0;
          paVar26->mColors[4] = (aiColor4D *)0x0;
          paVar26->mColors[5] = (aiColor4D *)0x0;
          paVar26->mColors[6] = (aiColor4D *)0x0;
          paVar26->mColors[7] = (aiColor4D *)0x0;
          local_b0._M_dataplus._M_p = (pointer)paVar26;
          if ((aiMesh **)local_88._8_8_ == local_78) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)local_88._M_local_buf,
                       (iterator)local_88._8_8_,(aiMesh **)&local_b0);
          }
          else {
            *(aiMesh **)local_88._8_8_ = paVar26;
            local_88._8_8_ = local_88._8_8_ + 8;
          }
          _Var18._M_p = local_b0._M_dataplus._M_p;
          uVar40 = (local_d8->super_Object).id._M_string_length;
          if (uVar40 < 0x400) {
            ((aiString *)(local_b0._M_dataplus._M_p + 0xec))->length = (uint)uVar40;
            memcpy(local_b0._M_dataplus._M_p + 0xf0,(local_d8->super_Object).id._M_dataplus._M_p,
                   uVar40);
            _Var18._M_p[uVar40 + 0xf0] = '\0';
          }
          if (1 < (ulong)(((long)*(pointer *)
                                  ((long)&(local_d8->primitives).
                                          super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                          ._M_impl + 8) -
                           *(long *)&(local_d8->primitives).
                                     super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                     ._M_impl.super__Vector_impl_data >> 4) * 0x4ec4ec4ec4ec4ec5)) {
            uVar23 = ((aiString *)(local_b0._M_dataplus._M_p + 0xec))->length;
            local_b0._M_dataplus._M_p[(ulong)uVar23 + 0xf0] = '-';
            pcVar45 = local_b0._M_dataplus._M_p + (ulong)uVar23 + 0xf1;
            uVar20 = 1;
            uVar40 = local_90 & 0xffffffff;
            if (((int)local_90 < 0) && (1 < 0x3ff - uVar23)) {
              local_b0._M_dataplus._M_p[(ulong)uVar23 + 0xf1] = '-';
              pcVar45 = local_b0._M_dataplus._M_p + (ulong)uVar23 + 0xf2;
              uVar40 = (ulong)(uint)-(int)local_90;
              uVar20 = 2;
            }
            iVar43 = 1000000000;
            bVar51 = false;
            do {
              pcVar39 = pcVar45;
              if (0x3ff - uVar23 <= uVar20) break;
              lVar15 = (long)(int)uVar40 / (long)iVar43;
              uVar37 = (long)(int)uVar40 % (long)iVar43 & 0xffffffff;
              if (((bVar51) || (iVar43 == 1)) || ((int)lVar15 != 0)) {
                pcVar39 = pcVar45 + 1;
                uVar20 = uVar20 + 1;
                *pcVar45 = (char)lVar15 + '0';
                bVar51 = true;
                uVar40 = uVar37;
                pcVar45 = pcVar39;
                if (iVar43 != 1) goto LAB_00641e33;
                bVar16 = false;
                iVar43 = 1;
              }
              else {
LAB_00641e33:
                iVar43 = iVar43 / 10;
                bVar16 = true;
                pcVar39 = pcVar45;
              }
              pcVar45 = pcVar39;
            } while (bVar16);
            *pcVar39 = '\0';
            ((aiString *)(local_b0._M_dataplus._M_p + 0xec))->length =
                 ((aiString *)(local_b0._M_dataplus._M_p + 0xec))->length + uVar20;
          }
          pPVar46 = pPVar46 + local_90;
          PVar4 = pPVar46->mode;
          if (PVar4 - PrimitiveMode_LINES < 3) {
            uVar23 = 2;
LAB_00641e9a:
            *(uint *)local_b0._M_dataplus._M_p = *(uint *)local_b0._M_dataplus._M_p | uVar23;
          }
          else {
            if (PVar4 - PrimitiveMode_TRIANGLES < 3) {
              uVar23 = 4;
              goto LAB_00641e9a;
            }
            uVar23 = 1;
            if (PVar4 == PrimitiveMode_POINTS) goto LAB_00641e9a;
          }
          pRVar27 = *(pointer *)
                     &(pPVar46->attributes).position.
                      super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                      ._M_impl;
          if ((*(pointer *)
                ((long)&(pPVar46->attributes).position.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                + 8) != pRVar27) &&
             (pRVar27->vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
             ) {
            *(uint *)(local_b0._M_dataplus._M_p + 4) =
                 *(uint *)(*(long *)(*(long *)&(pRVar27->vector->
                                               super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                               )._M_impl + (ulong)pRVar27->index * 8) + 100);
            puVar33 = *(undefined8 **)
                       &(pPVar46->attributes).position.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                        ._M_impl;
            glTF::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)(*(long *)*puVar33 + (ulong)*(uint *)(puVar33 + 1) * 8),
                       (aiVector3t<float> **)(local_b0._M_dataplus._M_p + 0x10));
          }
          pRVar27 = (pPVar46->attributes).normal.
                    super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((*(pointer *)
                ((long)&(pPVar46->attributes).normal.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                + 8) != pRVar27) &&
             (pRVar27->vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
             ) {
            glTF::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (*(long *)&(pRVar27->vector->
                                   super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                   )._M_impl + (ulong)pRVar27->index * 8),
                       (aiVector3t<float> **)(local_b0._M_dataplus._M_p + 0x18));
          }
          pRVar27 = (pPVar46->attributes).texcoord.
                    super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(pPVar46->attributes).texcoord.
                       super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
               + 8) != pRVar27) {
            uVar40 = 0;
            do {
              glTF::Accessor::ExtractData<aiVector3t<float>>
                        (*(Accessor **)
                          (*(long *)&((pRVar27[uVar40].vector)->
                                     super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                     )._M_impl + (ulong)pRVar27[uVar40].index * 8),
                         (aiVector3t<float> **)(local_b0._M_dataplus._M_p + uVar40 * 8 + 0x70));
              lVar15 = *(long *)&(pPVar46->attributes).texcoord.
                                 super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                                 ._M_impl.super__Vector_impl_data;
              *(undefined4 *)(local_b0._M_dataplus._M_p + uVar40 * 4 + 0xb0) =
                   *(undefined4 *)
                    (&DAT_009da1d8 +
                    (ulong)*(uint *)(*(long *)(**(long **)(lVar15 + uVar40 * 0x10) +
                                              (ulong)*(uint *)(lVar15 + 8 + uVar40 * 0x10) * 8) +
                                    0x68) * 0x10);
              if (*(uint *)(local_b0._M_dataplus._M_p + 4) != 0) {
                pfVar28 = (float *)(*(long *)(local_b0._M_dataplus._M_p + uVar40 * 8 + 0x70) + 4);
                uVar37 = 0;
                do {
                  *pfVar28 = 1.0 - *pfVar28;
                  uVar37 = uVar37 + 1;
                  pfVar28 = pfVar28 + 3;
                } while (uVar37 < *(uint *)(local_b0._M_dataplus._M_p + 4));
              }
              if (6 < uVar40) break;
              uVar40 = uVar40 + 1;
              pRVar27 = (pPVar46->attributes).texcoord.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar40 < (ulong)((long)*(pointer *)
                                             ((long)&(pPVar46->attributes).texcoord.
                                                                                                          
                                                  super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                                             + 8) - (long)pRVar27 >> 4));
          }
          pvVar9 = (pPVar46->indices).vector;
          if (pvVar9 == (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
            PVar4 = pPVar46->mode;
            if (PVar4 < (PrimitiveMode_TRIANGLE_FAN|PrimitiveMode_LINES)) {
              uVar23 = *(uint *)(local_b0._M_dataplus._M_p + 4);
              uVar40 = (ulong)uVar23;
              switch(PVar4) {
              case PrimitiveMode_POINTS:
                puVar29 = (ulong *)operator_new__(uVar40 * 0x10 + 8);
                *puVar29 = uVar40;
                paVar50 = (aiFace *)(puVar29 + 1);
                uVar37 = uVar40;
                if (uVar40 != 0) {
                  paVar32 = paVar50;
                  do {
                    paVar32->mNumIndices = 0;
                    paVar32->mIndices = (uint *)0x0;
                    paVar32 = paVar32 + 1;
                  } while (paVar32 != paVar50 + uVar40);
                  uVar42 = 0;
                  do {
                    *(undefined4 *)(puVar29 + 1) = 1;
                    puVar31 = (undefined4 *)operator_new__(4);
                    puVar29[2] = (ulong)puVar31;
                    *puVar31 = (int)uVar42;
                    uVar42 = uVar42 + 1;
                    puVar29 = puVar29 + 2;
                  } while (uVar40 != uVar42);
                }
                break;
              case PrimitiveMode_LINES:
                uVar37 = (ulong)(uVar23 >> 1);
                puVar29 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
                *puVar29 = uVar37;
                paVar50 = (aiFace *)(puVar29 + 1);
                if (1 < uVar23) {
                  paVar32 = paVar50;
                  do {
                    paVar32->mNumIndices = 0;
                    paVar32->mIndices = (uint *)0x0;
                    paVar32 = paVar32 + 1;
                  } while (paVar32 != paVar50 + uVar37);
                }
                if (uVar40 != 0) {
                  uVar20 = 0;
                  do {
                    paVar50[uVar20 >> 1].mNumIndices = 2;
                    puVar30 = (uint *)operator_new__(8);
                    paVar50[uVar20 >> 1].mIndices = puVar30;
                    *puVar30 = uVar20;
                    puVar30[1] = uVar20 + 1;
                    uVar20 = uVar20 + 2;
                  } while (uVar20 < uVar23);
                }
                break;
              default:
                uVar20 = uVar23 - (PVar4 == PrimitiveMode_LINE_STRIP);
                uVar37 = (ulong)uVar20;
                puVar29 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
                *puVar29 = uVar37;
                paVar50 = (aiFace *)(puVar29 + 1);
                if (uVar20 != 0) {
                  paVar32 = paVar50;
                  do {
                    paVar32->mNumIndices = 0;
                    paVar32->mIndices = (uint *)0x0;
                    paVar32 = paVar32 + 1;
                  } while (paVar32 != paVar50 + uVar37);
                }
                paVar50->mNumIndices = 2;
                puVar33 = (undefined8 *)operator_new__(8);
                puVar29[2] = (ulong)puVar33;
                *puVar33 = 0x100000000;
                if (2 < uVar23) {
                  puVar47 = puVar29 + 4;
                  uVar42 = 2;
                  do {
                    uVar5 = *(undefined4 *)(puVar47[-2] + 4);
                    *(undefined4 *)(puVar47 + -1) = 2;
                    puVar31 = (undefined4 *)operator_new__(8);
                    *puVar47 = (ulong)puVar31;
                    *puVar31 = uVar5;
                    puVar31[1] = (int)uVar42;
                    uVar42 = uVar42 + 1;
                    puVar47 = puVar47 + 2;
                  } while (uVar40 != uVar42);
                }
                if (pPVar46->mode == PrimitiveMode_LINE_LOOP) {
                  uVar20 = *(uint *)(puVar29[(ulong)(uVar23 - 2) * 2 + 2] + 4);
                  uVar21 = *(uint *)puVar29[2];
                  paVar50[uVar23 - 1].mNumIndices = 2;
                  puVar30 = (uint *)operator_new__(8);
                  paVar50[uVar23 - 1].mIndices = puVar30;
                  *puVar30 = uVar20;
                  puVar30[1] = uVar21;
                }
                break;
              case PrimitiveMode_TRIANGLES:
                uVar37 = uVar40 / 3;
                puVar29 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
                *puVar29 = uVar37;
                paVar50 = (aiFace *)(puVar29 + 1);
                if (2 < uVar23) {
                  paVar32 = paVar50;
                  do {
                    paVar32->mNumIndices = 0;
                    paVar32->mIndices = (uint *)0x0;
                    paVar32 = paVar32 + 1;
                  } while (paVar32 != paVar50 + uVar37);
                }
                if (uVar40 != 0) {
                  uVar20 = 0;
                  do {
                    uVar40 = (ulong)uVar20 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                    *(undefined4 *)((long)&paVar50->mNumIndices + uVar40) = 3;
                    puVar30 = (uint *)operator_new__(0xc);
                    *(uint **)((long)&paVar50->mIndices + uVar40) = puVar30;
                    *puVar30 = uVar20;
                    puVar30[1] = uVar20 + 1;
                    puVar30[2] = uVar20 + 2;
                    uVar20 = uVar20 + 3;
                  } while (uVar20 < uVar23);
                }
                break;
              case PrimitiveMode_TRIANGLE_STRIP:
                uVar37 = (ulong)(uVar23 - 2);
                puVar29 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
                *puVar29 = uVar37;
                paVar50 = (aiFace *)(puVar29 + 1);
                if (uVar23 - 2 != 0) {
                  paVar32 = paVar50;
                  do {
                    paVar32->mNumIndices = 0;
                    paVar32->mIndices = (uint *)0x0;
                    paVar32 = paVar32 + 1;
                  } while (paVar32 != paVar50 + uVar37);
                }
                paVar50->mNumIndices = 3;
                puVar33 = (undefined8 *)operator_new__(0xc);
                puVar29[2] = (ulong)puVar33;
                *puVar33 = 0x100000000;
                *(undefined4 *)(puVar33 + 1) = 2;
                if (3 < uVar23) {
                  puVar29 = puVar29 + 3;
                  uVar42 = 3;
                  do {
                    uVar5 = *(undefined4 *)(puVar29[3] + 4);
                    uVar6 = *(undefined4 *)(puVar29[3] + 8);
                    *(undefined4 *)puVar29 = 3;
                    puVar31 = (undefined4 *)operator_new__(0xc);
                    puVar29[1] = (ulong)puVar31;
                    *puVar31 = uVar5;
                    puVar31[1] = uVar6;
                    puVar31[2] = (int)uVar42;
                    uVar42 = uVar42 + 1;
                    puVar29 = puVar29 + 2;
                  } while (uVar40 != uVar42);
                }
                break;
              case PrimitiveMode_TRIANGLE_FAN:
                uVar37 = (ulong)(uVar23 - 2);
                puVar29 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
                *puVar29 = uVar37;
                paVar50 = (aiFace *)(puVar29 + 1);
                if (uVar23 - 2 != 0) {
                  paVar32 = paVar50;
                  do {
                    paVar32->mNumIndices = 0;
                    paVar32->mIndices = (uint *)0x0;
                    paVar32 = paVar32 + 1;
                  } while (paVar32 != paVar50 + uVar37);
                }
                paVar50->mNumIndices = 3;
                puVar33 = (undefined8 *)operator_new__(0xc);
                puVar29[2] = (ulong)puVar33;
                *puVar33 = 0x100000000;
                *(undefined4 *)(puVar33 + 1) = 2;
                if (3 < uVar23) {
                  puVar47 = puVar29 + 3;
                  uVar42 = 3;
                  do {
                    uVar5 = *(undefined4 *)puVar29[2];
                    uVar6 = *(undefined4 *)(puVar47[3] + 8);
                    *(undefined4 *)puVar47 = 3;
                    puVar31 = (undefined4 *)operator_new__(0xc);
                    puVar47[1] = (ulong)puVar31;
                    *puVar31 = uVar5;
                    puVar31[1] = uVar6;
                    puVar31[2] = (int)uVar42;
                    uVar42 = uVar42 + 1;
                    puVar47 = puVar47 + 2;
                  } while (uVar40 != uVar42);
                }
              }
            }
            else {
              paVar50 = (aiFace *)0x0;
              uVar37 = 0;
            }
          }
          else {
            uVar23 = *(uint *)(*(long *)(*(long *)&(pvVar9->
                                                  super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                                  )._M_impl + (ulong)(pPVar46->indices).index * 8) +
                              100);
            uVar40 = (ulong)uVar23;
            pAVar38 = *(Accessor **)
                       (*(long *)&(((pPVar46->indices).vector)->
                                  super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                  )._M_impl + (ulong)(pPVar46->indices).index * 8);
            pvVar10 = (pAVar38->bufferView).vector;
            if (pvVar10 == (vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *)0x0) {
LAB_0064207c:
              local_d0.data = (uint8_t *)0x0;
            }
            else {
              pBVar11 = (pvVar10->
                        super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)
                        ._M_impl.super__Vector_impl_data._M_start[(pAVar38->bufferView).index];
              pvVar12 = (pBVar11->buffer).vector;
              if (pvVar12 == (vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *)0x0)
              goto LAB_0064207c;
              lVar15 = *(long *)(*(long *)&pvVar12->
                                           super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>
                                + (ulong)(pBVar11->buffer).index * 8);
              lVar13 = *(long *)(lVar15 + 0x60);
              if (lVar13 == 0) goto LAB_0064207c;
              uVar37 = (ulong)pAVar38->byteOffset + pBVar11->byteOffset;
              puVar29 = *(ulong **)(lVar15 + 0x58);
              if (puVar29 == (ulong *)0x0) {
LAB_006427e4:
                local_d0.data = (uint8_t *)(lVar13 + uVar37);
              }
              else {
                uVar42 = *puVar29;
                bVar51 = true;
                local_d0.data = (uint8_t *)(uVar37 - uVar42);
                if ((uVar42 <= uVar37) && (uVar37 < uVar42 + puVar29[3])) {
                  local_d0.data = local_d0.data + puVar29[2];
                  bVar51 = false;
                }
                if (bVar51) goto LAB_006427e4;
              }
            }
            local_d0.accessor = pAVar38;
            uVar20 = glTF::Accessor::GetElementSize(pAVar38);
            local_d0.elemSize = (size_t)uVar20;
            local_d0.stride = (ulong)pAVar38->byteStride;
            if ((ulong)pAVar38->byteStride == 0) {
              local_d0.stride = local_d0.elemSize;
            }
            if (local_d0.data == (uint8_t *)0x0) {
              __assert_fail("data.IsValid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF/glTFImporter.cpp"
                            ,0x13f,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
            }
            switch(pPVar46->mode) {
            case PrimitiveMode_POINTS:
              puVar29 = (ulong *)operator_new__(uVar40 * 0x10 + 8);
              *puVar29 = uVar40;
              paVar50 = (aiFace *)(puVar29 + 1);
              uVar37 = uVar40;
              if (uVar40 != 0) {
                paVar32 = paVar50;
                do {
                  paVar32->mNumIndices = 0;
                  paVar32->mIndices = (uint *)0x0;
                  paVar32 = paVar32 + 1;
                } while (paVar32 != paVar50 + uVar40);
                uVar42 = 0;
                do {
                  uVar23 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,(int)uVar42);
                  *(undefined4 *)(puVar29 + 1) = 1;
                  puVar30 = (uint *)operator_new__(4);
                  puVar29[2] = (ulong)puVar30;
                  *puVar30 = uVar23;
                  uVar42 = uVar42 + 1;
                  puVar29 = puVar29 + 2;
                } while (uVar40 != uVar42);
              }
              break;
            case PrimitiveMode_LINES:
              uVar37 = (ulong)(uVar23 >> 1);
              puVar29 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
              *puVar29 = uVar37;
              paVar50 = (aiFace *)(puVar29 + 1);
              if (1 < uVar23) {
                paVar32 = paVar50;
                do {
                  paVar32->mNumIndices = 0;
                  paVar32->mIndices = (uint *)0x0;
                  paVar32 = paVar32 + 1;
                } while (paVar32 != paVar50 + uVar37);
              }
              if (uVar40 != 0) {
                uVar20 = 0;
                do {
                  uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,uVar20);
                  uVar22 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,uVar20 + 1);
                  paVar50[uVar20 >> 1].mNumIndices = 2;
                  puVar30 = (uint *)operator_new__(8);
                  paVar50[uVar20 >> 1].mIndices = puVar30;
                  *puVar30 = uVar21;
                  puVar30[1] = uVar22;
                  uVar20 = uVar20 + 2;
                } while (uVar20 < uVar23);
              }
              break;
            case PrimitiveMode_LINE_LOOP:
            case PrimitiveMode_LINE_STRIP:
              uVar20 = uVar23 - (pPVar46->mode == PrimitiveMode_LINE_STRIP);
              uVar37 = (ulong)uVar20;
              puVar29 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
              *puVar29 = uVar37;
              paVar50 = (aiFace *)(puVar29 + 1);
              if (uVar20 != 0) {
                paVar32 = paVar50;
                do {
                  paVar32->mNumIndices = 0;
                  paVar32->mIndices = (uint *)0x0;
                  paVar32 = paVar32 + 1;
                } while (paVar32 != paVar50 + uVar37);
              }
              uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,0);
              uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,1);
              paVar50->mNumIndices = 2;
              puVar30 = (uint *)operator_new__(8);
              puVar29[2] = (ulong)puVar30;
              *puVar30 = uVar20;
              puVar30[1] = uVar21;
              if (2 < uVar23) {
                puVar47 = puVar29 + 4;
                uVar42 = 2;
                do {
                  uVar5 = *(undefined4 *)(puVar47[-2] + 4);
                  uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,(int)uVar42);
                  *(undefined4 *)(puVar47 + -1) = 2;
                  puVar31 = (undefined4 *)operator_new__(8);
                  *puVar47 = (ulong)puVar31;
                  *puVar31 = uVar5;
                  puVar31[1] = uVar20;
                  uVar42 = uVar42 + 1;
                  puVar47 = puVar47 + 2;
                } while (uVar40 != uVar42);
              }
              if (pPVar46->mode == PrimitiveMode_LINE_LOOP) {
                uVar20 = *(uint *)(puVar29[(ulong)(uVar23 - 2) * 2 + 2] + 4);
                uVar21 = *(uint *)puVar29[2];
                paVar50[uVar23 - 1].mNumIndices = 2;
                puVar30 = (uint *)operator_new__(8);
                paVar50[uVar23 - 1].mIndices = puVar30;
                *puVar30 = uVar20;
                puVar30[1] = uVar21;
              }
              break;
            case PrimitiveMode_TRIANGLES:
              uVar37 = uVar40 / 3;
              puVar29 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
              *puVar29 = uVar37;
              paVar50 = (aiFace *)(puVar29 + 1);
              if (2 < uVar23) {
                paVar32 = paVar50;
                do {
                  paVar32->mNumIndices = 0;
                  paVar32->mIndices = (uint *)0x0;
                  paVar32 = paVar32 + 1;
                } while (paVar32 != paVar50 + uVar37);
              }
              if (uVar40 != 0) {
                uVar20 = 0;
                do {
                  uVar40 = (ulong)uVar20 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                  uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,uVar20);
                  uVar22 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,uVar20 + 1);
                  uVar24 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,uVar20 + 2);
                  *(undefined4 *)((long)&paVar50->mNumIndices + uVar40) = 3;
                  puVar30 = (uint *)operator_new__(0xc);
                  *(uint **)((long)&paVar50->mIndices + uVar40) = puVar30;
                  *puVar30 = uVar21;
                  puVar30[1] = uVar22;
                  puVar30[2] = uVar24;
                  uVar20 = uVar20 + 3;
                } while (uVar20 < uVar23);
              }
              break;
            case PrimitiveMode_TRIANGLE_STRIP:
              uVar37 = (ulong)(uVar23 - 2);
              puVar29 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
              *puVar29 = uVar37;
              paVar50 = (aiFace *)(puVar29 + 1);
              if (uVar23 - 2 != 0) {
                paVar32 = paVar50;
                do {
                  paVar32->mNumIndices = 0;
                  paVar32->mIndices = (uint *)0x0;
                  paVar32 = paVar32 + 1;
                } while (paVar32 != paVar50 + uVar37);
              }
              uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,0);
              uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,1);
              uVar22 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,2);
              paVar50->mNumIndices = 3;
              puVar30 = (uint *)operator_new__(0xc);
              puVar29[2] = (ulong)puVar30;
              *puVar30 = uVar20;
              puVar30[1] = uVar21;
              puVar30[2] = uVar22;
              if (3 < uVar23) {
                puVar29 = puVar29 + 3;
                uVar42 = 3;
                do {
                  uVar5 = *(undefined4 *)(puVar29[3] + 4);
                  uVar6 = *(undefined4 *)(puVar29[3] + 8);
                  uVar23 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,(int)uVar42);
                  *(undefined4 *)puVar29 = 3;
                  puVar31 = (undefined4 *)operator_new__(0xc);
                  puVar29[1] = (ulong)puVar31;
                  *puVar31 = uVar5;
                  puVar31[1] = uVar6;
                  puVar31[2] = uVar23;
                  uVar42 = uVar42 + 1;
                  puVar29 = puVar29 + 2;
                } while (uVar40 != uVar42);
              }
              break;
            case PrimitiveMode_TRIANGLE_FAN:
              uVar37 = (ulong)(uVar23 - 2);
              local_68 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
              *local_68 = uVar37;
              paVar50 = (aiFace *)(local_68 + 1);
              if (uVar23 - 2 != 0) {
                paVar32 = paVar50;
                do {
                  paVar32->mNumIndices = 0;
                  paVar32->mIndices = (uint *)0x0;
                  paVar32 = paVar32 + 1;
                } while (paVar32 != paVar50 + uVar37);
              }
              uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,0);
              uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,1);
              uVar22 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,2);
              paVar50->mNumIndices = 3;
              puVar30 = (uint *)operator_new__(0xc);
              local_68[2] = (ulong)puVar30;
              *puVar30 = uVar20;
              puVar30[1] = uVar21;
              puVar30[2] = uVar22;
              if (3 < uVar23) {
                puVar29 = local_68 + 3;
                uVar42 = 3;
                do {
                  uVar5 = *(undefined4 *)local_68[2];
                  uVar6 = *(undefined4 *)(puVar29[3] + 8);
                  uVar23 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d0,(int)uVar42);
                  *(undefined4 *)puVar29 = 3;
                  puVar31 = (undefined4 *)operator_new__(0xc);
                  puVar29[1] = (ulong)puVar31;
                  *puVar31 = uVar5;
                  puVar31[1] = uVar6;
                  puVar31[2] = uVar23;
                  uVar42 = uVar42 + 1;
                  puVar29 = puVar29 + 2;
                } while (uVar40 != uVar42);
              }
              break;
            default:
              paVar50 = (aiFace *)0x0;
              uVar37 = 0;
            }
          }
          if (paVar50 != (aiFace *)0x0) {
            *(aiFace **)(local_b0._M_dataplus._M_p + 0xd0) = paVar50;
            *(uint *)(local_b0._M_dataplus._M_p + 8) = (uint)uVar37;
            bVar51 = (uint)uVar37 == 0;
            if (!bVar51) {
              uVar40 = 0;
              bVar51 = false;
              do {
                uVar42 = (ulong)paVar50[uVar40].mNumIndices;
                if (uVar42 != 0) {
                  if (*(uint *)(local_b0._M_dataplus._M_p + 4) <= *paVar50[uVar40].mIndices) break;
                  uVar44 = 0;
                  do {
                    if (uVar42 - 1 == uVar44) goto LAB_00642bf9;
                    uVar2 = uVar44 + 1;
                    lVar15 = uVar44 + 1;
                    uVar44 = uVar2;
                  } while (paVar50[uVar40].mIndices[lVar15] <
                           *(uint *)(local_b0._M_dataplus._M_p + 4));
                  if (uVar2 < uVar42) break;
                }
LAB_00642bf9:
                uVar40 = uVar40 + 1;
                bVar51 = uVar37 <= uVar40;
              } while (uVar40 != uVar37);
            }
            if (!bVar51) {
              __assert_fail("CheckValidFacesIndices(faces, nFaces, aim->mNumVertices)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF/glTFImporter.cpp"
                            ,0x1c2,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
            }
          }
          if ((pPVar46->material).vector !=
              (vector<glTF::Material_*,_std::allocator<glTF::Material_*>_> *)0x0) {
            *(uint *)(local_b0._M_dataplus._M_p + 0xe8) = (pPVar46->material).index;
          }
          local_90 = (ulong)((int)local_90 + 1);
          pPVar46 = (local_d8->primitives).
                    super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar40 = ((long)*(pointer *)
                           ((long)&(local_d8->primitives).
                                   super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                   ._M_impl + 8) - (long)pPVar46 >> 4) * 0x4ec4ec4ec4ec4ec5;
        } while (local_90 <= uVar40 && uVar40 - local_90 != 0);
      }
      uVar48 = uVar48 + 1;
      ppMVar25 = (local_70->meshes).mObjs.
                 super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar48 < ((ulong)((long)(local_70->meshes).mObjs.
                                     super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar25) >>
                       3 & 0xffffffff));
  }
  iVar8._M_current =
       (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->meshOffsets,iVar8,
               &local_dc);
  }
  else {
    *iVar8._M_current = local_dc;
    ppuVar3 = &(this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar3 = *ppuVar3 + 1;
  }
  uVar19 = local_88._8_8_;
  uVar41 = local_88._M_allocated_capacity;
  paVar14 = this->mScene;
  uVar23 = (uint)((ulong)(local_88._8_8_ - local_88._0_8_) >> 3);
  paVar14->mNumMeshes = uVar23;
  if (uVar23 != 0) {
    ppaVar34 = (aiMesh **)operator_new__(local_88._8_8_ - local_88._0_8_ & 0x7fffffff8);
    paVar14->mMeshes = ppaVar34;
    for (; uVar41 != uVar19; uVar41 = uVar41 + 8) {
      paVar26 = *(aiMesh **)uVar41;
      *(aiMesh **)uVar41 = *ppaVar34;
      *ppaVar34 = paVar26;
      ppaVar34 = ppaVar34 + 1;
    }
  }
  if ((aiMesh **)local_88._M_allocated_capacity != (aiMesh **)0x0) {
    operator_delete((void *)local_88._M_allocated_capacity);
  }
  return;
}

Assistant:

void glTFImporter::ImportMeshes(glTF::Asset& r)
{
    std::vector<aiMesh*> meshes;

    unsigned int k = 0;

    for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
        Mesh& mesh = r.meshes[m];

		// Check if mesh extensions is used
		if(mesh.Extension.size() > 0)
		{
			for(Mesh::SExtension* cur_ext : mesh.Extension)
			{
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
				if(cur_ext->Type == Mesh::SExtension::EType::Compression_Open3DGC)
				{
					// Limitations for meshes when using Open3DGC-compression.
					// It's a current limitation of sp... Specification have not this part still - about mesh compression. Why only one primitive?
					// Because glTF is very flexibly. But in fact it ugly flexible. Every primitive can has own set of accessors and accessors can
					// point to a-a-a-a-any part of buffer (through bufferview of course) and even to another buffer. We know that "Open3DGC-compression"
					// is applicable only to part of buffer. As we can't guaranty continuity of the data for decoder, we will limit quantity of primitives.
					// Yes indices, coordinates etc. still can br stored in different buffers, but with current specification it's a exporter problem.
					// Also primitive can has only one of "POSITION", "NORMAL" and less then "AI_MAX_NUMBER_OF_TEXTURECOORDS" of "TEXCOORD". All accessor
					// of primitive must point to one continuous region of the buffer.
					if(mesh.primitives.size() > 2) throw DeadlyImportError("GLTF: When using Open3DGC compression then only one primitive per mesh are allowed.");

					Mesh::SCompression_Open3DGC* o3dgc_ext = (Mesh::SCompression_Open3DGC*)cur_ext;
					Ref<Buffer> buf = r.buffers.Get(o3dgc_ext->Buffer);

					buf->EncodedRegion_SetCurrent(mesh.id);
				}
				else
#endif
				{
					throw DeadlyImportError("GLTF: Can not import mesh: unknown mesh extension (code: \"" + to_string(cur_ext->Type) +
											"\"), only Open3DGC is supported.");
				}
			}
		}// if(mesh.Extension.size() > 0)

		meshOffsets.push_back(k);
        k += unsigned(mesh.primitives.size());

        for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
            Mesh::Primitive& prim = mesh.primitives[p];

            aiMesh* aim = new aiMesh();
            meshes.push_back(aim);

            aim->mName = mesh.id;
            if (mesh.primitives.size() > 1) {
                ai_uint32& len = aim->mName.length;
                aim->mName.data[len] = '-';
                len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
            }

            switch (prim.mode) {
                case PrimitiveMode_POINTS:
                    aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;

                case PrimitiveMode_LINES:
                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP:
                    aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;

                case PrimitiveMode_TRIANGLES:
                case PrimitiveMode_TRIANGLE_STRIP:
                case PrimitiveMode_TRIANGLE_FAN:
                    aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
            }

            Mesh::Primitive::Attributes& attr = prim.attributes;

			if (attr.position.size() > 0 && attr.position[0]) {
                aim->mNumVertices = attr.position[0]->count;
                attr.position[0]->ExtractData(aim->mVertices);
			}

			if (attr.normal.size() > 0 && attr.normal[0]) attr.normal[0]->ExtractData(aim->mNormals);

            for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
                attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
                aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

                aiVector3D* values = aim->mTextureCoords[tc];
                for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                    values[i].y = 1 - values[i].y; // Flip Y coords
                }
            }


            aiFace* faces = 0;
            unsigned int nFaces = 0;

            if (prim.indices) {
                unsigned int count = prim.indices->count;

                Accessor::Indexer data = prim.indices->GetIndexer();
                ai_assert(data.IsValid());

                switch (prim.mode) {
                    case PrimitiveMode_POINTS: {
                        nFaces = count;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; ++i) {
                            SetFace(faces[i], data.GetUInt(i));
                        }
                        break;
                    }

                    case PrimitiveMode_LINES: {
                        nFaces = count / 2;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 2) {
                            SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
                        }
                        break;
                    }

                    case PrimitiveMode_LINE_LOOP:
                    case PrimitiveMode_LINE_STRIP: {
                        nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
                        for (unsigned int i = 2; i < count; ++i) {
                            SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
                        }
                        if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                            SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                        }
                        break;
                    }

                    case PrimitiveMode_TRIANGLES: {
                        nFaces = count / 3;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 3) {
                            SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_STRIP: {
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_FAN:
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                }
            }
            else { // no indices provided so directly generate from counts

                // use the already determined count as it includes checks 
                unsigned int count = aim->mNumVertices;

                switch (prim.mode) {
                case PrimitiveMode_POINTS: {
                    nFaces = count;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; ++i) {
                        SetFace(faces[i], i);
                    }
                    break;
                }

                case PrimitiveMode_LINES: {
                    nFaces = count / 2;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 2) {
                        SetFace(faces[i / 2], i, i + 1);
                    }
                    break;
                }

                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP: {
                    nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1);
                    for (unsigned int i = 2; i < count; ++i) {
                        SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
                    }
                    if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                        SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                    }
                    break;
                }

                case PrimitiveMode_TRIANGLES: {
                    nFaces = count / 3;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 3) {
                        SetFace(faces[i / 3], i, i + 1, i + 2);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_STRIP: {
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_FAN:
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
            }

            if (faces) {
                aim->mFaces = faces;
                aim->mNumFaces = nFaces;
                ai_assert(CheckValidFacesIndices(faces, nFaces, aim->mNumVertices));
            }

            if (prim.material) {
                aim->mMaterialIndex = prim.material.GetIndex();
            }
        }
    }

    meshOffsets.push_back(k);

    CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}